

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall ProStringList::insertUnique(ProStringList *this,ProStringList *value)

{
  bool bVar1;
  ProString *str;
  ProString *str_00;
  long lVar2;
  
  lVar2 = (value->super_QList<ProString>).d.size;
  if (lVar2 != 0) {
    str_00 = (value->super_QList<ProString>).d.ptr;
    lVar2 = lVar2 * 0x30;
    do {
      if ((str_00->m_length != 0) && (bVar1 = contains(this,str_00,CaseSensitive), !bVar1)) {
        QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
                  ((QMovableArrayOps<ProString> *)this,(this->super_QList<ProString>).d.size,str_00)
        ;
        QList<ProString>::end(&this->super_QList<ProString>);
      }
      str_00 = str_00 + 1;
      lVar2 = lVar2 + -0x30;
    } while (lVar2 != 0);
  }
  return;
}

Assistant:

const T *constEnd() const noexcept { return data() + size; }